

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v5::internal::
       parse_align<char,fmt::v5::formatter<std::chrono::duration<long,std::ratio<1l,1000000l>>,char,void>::spec_handler&>
                 (char *begin,char *end,spec_handler *handler)

{
  char cVar1;
  bool bVar2;
  alignment aVar3;
  ulong uVar4;
  formatter<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_char,_void> *pfVar5;
  char *pcVar6;
  
  pcVar6 = begin + 1;
  uVar4 = (ulong)(pcVar6 != end);
  do {
    cVar1 = begin[uVar4];
    if (cVar1 == '<') {
      aVar3 = ALIGN_LEFT;
LAB_0011b628:
      if ((int)uVar4 == 0) {
        pfVar5 = handler->f;
      }
      else {
        if (*begin == L'{') {
          formatter<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_char,_void>::
          spec_handler::on_error(handler,"invalid fill character \'{\'");
          return begin;
        }
        pcVar6 = begin + 2;
        pfVar5 = handler->f;
        (pfVar5->spec).fill_ = (int)*begin;
      }
      (pfVar5->spec).align_ = aVar3;
      return pcVar6;
    }
    if (cVar1 == '^') {
      aVar3 = ALIGN_CENTER;
      goto LAB_0011b628;
    }
    if (cVar1 == '>') {
      aVar3 = ALIGN_RIGHT;
      goto LAB_0011b628;
    }
    if (cVar1 == '=') {
      aVar3 = ALIGN_NUMERIC;
      goto LAB_0011b628;
    }
    bVar2 = (long)uVar4 < 1;
    uVar4 = uVar4 - 1;
    if (bVar2) {
      return begin;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR const Char *parse_align(
    const Char *begin, const Char *end, Handler &&handler) {
  FMT_ASSERT(begin != end, "");
  alignment align = ALIGN_DEFAULT;
  int i = 0;
  if (begin + 1 != end) ++i;
  do {
    switch (static_cast<char>(begin[i])) {
    case '<':
      align = ALIGN_LEFT;
      break;
    case '>':
      align = ALIGN_RIGHT;
      break;
    case '=':
      align = ALIGN_NUMERIC;
      break;
    case '^':
      align = ALIGN_CENTER;
      break;
    }
    if (align != ALIGN_DEFAULT) {
      if (i > 0) {
        auto c = *begin;
        if (c == '{')
          return handler.on_error("invalid fill character '{'"), begin;
        begin += 2;
        handler.on_fill(c);
      } else ++begin;
      handler.on_align(align);
      break;
    }
  } while (i-- > 0);
  return begin;
}